

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

Lit_t __thiscall Potassco::SmodelsConvert::get(SmodelsConvert *this,Lit_t in)

{
  Lit_t LVar1;
  
  LVar1 = SmData::mapLit(this->data_,in);
  return LVar1;
}

Assistant:

Lit_t SmodelsConvert::get(Lit_t in) const {
	return data_->mapLit(in);
}